

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disci_intersector.h
# Opt level: O1

void embree::avx::DiscMiIntersectorK<4,_8,_true>::intersect
               (Precalculations *pre,RayHitK<8> *ray,size_t k,RayQueryContext *context,
               Primitive *Disc)

{
  float fVar1;
  float fVar2;
  float fVar3;
  undefined4 uVar4;
  Scene *pSVar5;
  Geometry *pGVar6;
  __int_type_conflict _Var7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  uint uVar12;
  undefined4 uVar13;
  RayHitK<8> *pRVar14;
  uint uVar16;
  long lVar17;
  long lVar18;
  ulong uVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [16];
  undefined1 auVar25 [32];
  float fVar26;
  float fVar29;
  float fVar30;
  undefined1 auVar27 [16];
  float fVar31;
  undefined1 auVar28 [16];
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar45 [64];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [64];
  float fVar50;
  float fVar53;
  float fVar54;
  float fVar55;
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [64];
  vbool<4> valid;
  RTCFilterFunctionNArguments args;
  undefined1 local_2b0 [16];
  undefined8 local_2a0;
  undefined8 uStack_298;
  undefined8 local_290;
  undefined8 uStack_288;
  undefined1 local_270 [16];
  Primitive *local_258;
  undefined8 *local_250;
  void *local_248;
  RTCRayQueryContext *local_240;
  RayHitK<8> *local_238;
  undefined1 (*local_230) [32];
  undefined4 local_228;
  undefined1 local_220 [32];
  undefined1 local_200 [16];
  undefined1 local_1f0 [16];
  float local_1e0 [4];
  float local_1d0 [4];
  undefined1 local_1c0 [32];
  undefined1 local_190 [16];
  undefined1 local_180 [32];
  undefined1 local_160 [32];
  undefined1 local_140 [32];
  undefined4 local_120;
  undefined4 uStack_11c;
  undefined4 uStack_118;
  undefined4 uStack_114;
  undefined4 uStack_110;
  undefined4 uStack_10c;
  undefined4 uStack_108;
  undefined4 uStack_104;
  undefined4 local_100;
  undefined4 uStack_fc;
  undefined4 uStack_f8;
  undefined4 uStack_f4;
  undefined4 uStack_f0;
  undefined4 uStack_ec;
  undefined4 uStack_e8;
  undefined4 uStack_e4;
  uint local_e0;
  uint uStack_dc;
  uint uStack_d8;
  uint uStack_d4;
  uint uStack_d0;
  uint uStack_cc;
  uint uStack_c8;
  uint uStack_c4;
  undefined1 local_c0 [16];
  undefined1 auStack_b0 [16];
  uint local_a0;
  uint uStack_9c;
  uint uStack_98;
  uint uStack_94;
  uint uStack_90;
  uint uStack_8c;
  uint uStack_88;
  uint uStack_84;
  uint local_80;
  uint uStack_7c;
  uint uStack_78;
  uint uStack_74;
  uint uStack_70;
  uint uStack_6c;
  uint uStack_68;
  uint uStack_64;
  ulong uVar15;
  undefined1 auVar44 [64];
  
  pSVar5 = context->scene;
  pGVar6 = (pSVar5->geometries).items[Disc->sharedGeomID].ptr;
  lVar18 = *(long *)&pGVar6->field_0x58;
  _Var7 = pGVar6[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  auVar20 = *(undefined1 (*) [16])(lVar18 + (Disc->primIDs).field_0.i[0] * _Var7);
  auVar47 = *(undefined1 (*) [16])(lVar18 + (Disc->primIDs).field_0.i[1] * _Var7);
  auVar41 = *(undefined1 (*) [16])(lVar18 + (Disc->primIDs).field_0.i[2] * _Var7);
  auVar40 = *(undefined1 (*) [16])(lVar18 + (Disc->primIDs).field_0.i[3] * _Var7);
  auVar24 = vunpcklps_avx(auVar20,auVar41);
  auVar28 = vunpckhps_avx(auVar20,auVar41);
  auVar20 = vunpcklps_avx(auVar47,auVar40);
  auVar48 = vunpckhps_avx(auVar47,auVar40);
  auVar40 = vunpcklps_avx(auVar24,auVar20);
  auVar47 = vunpckhps_avx(auVar24,auVar20);
  auVar42 = vunpcklps_avx(auVar28,auVar48);
  auVar20 = vpshufd_avx(ZEXT116(Disc->numPrimitives),0);
  auVar41 = vpcmpgtd_avx(auVar20,_DAT_01ff0cf0);
  local_190 = vpshufd_avx(ZEXT416(Disc->sharedGeomID),0);
  uVar13 = *(undefined4 *)(ray + k * 4);
  auVar27._4_4_ = uVar13;
  auVar27._0_4_ = uVar13;
  auVar27._8_4_ = uVar13;
  auVar27._12_4_ = uVar13;
  auVar40 = vsubps_avx(auVar40,auVar27);
  uVar13 = *(undefined4 *)(ray + k * 4 + 0x20);
  auVar24._4_4_ = uVar13;
  auVar24._0_4_ = uVar13;
  auVar24._8_4_ = uVar13;
  auVar24._12_4_ = uVar13;
  auVar24 = vsubps_avx(auVar47,auVar24);
  uVar13 = *(undefined4 *)(ray + k * 4 + 0x40);
  auVar20._4_4_ = uVar13;
  auVar20._0_4_ = uVar13;
  auVar20._8_4_ = uVar13;
  auVar20._12_4_ = uVar13;
  auVar42 = vsubps_avx(auVar42,auVar20);
  fVar1 = *(float *)(ray + k * 4 + 0x80);
  fVar2 = *(float *)(ray + k * 4 + 0xa0);
  fVar3 = *(float *)(ray + k * 4 + 0xc0);
  auVar20 = ZEXT416((uint)(fVar1 * fVar1 + fVar2 * fVar2 + fVar3 * fVar3));
  auVar47 = vshufps_avx(auVar20,auVar20,0);
  auVar20 = vrcpps_avx(auVar47);
  fVar50 = auVar20._0_4_;
  auVar46._0_4_ = fVar50 * auVar47._0_4_;
  fVar53 = auVar20._4_4_;
  auVar46._4_4_ = fVar53 * auVar47._4_4_;
  fVar54 = auVar20._8_4_;
  auVar46._8_4_ = fVar54 * auVar47._8_4_;
  fVar55 = auVar20._12_4_;
  auVar46._12_4_ = fVar55 * auVar47._12_4_;
  auVar56._8_4_ = 0x3f800000;
  auVar56._0_8_ = &DAT_3f8000003f800000;
  auVar56._12_4_ = 0x3f800000;
  auVar20 = vsubps_avx(auVar56,auVar46);
  fVar36 = auVar42._0_4_;
  fVar37 = auVar42._4_4_;
  fVar38 = auVar42._8_4_;
  fVar39 = auVar42._12_4_;
  fVar32 = auVar24._0_4_;
  fVar33 = auVar24._4_4_;
  fVar34 = auVar24._8_4_;
  fVar35 = auVar24._12_4_;
  fVar26 = auVar40._0_4_;
  fVar29 = auVar40._4_4_;
  fVar30 = auVar40._8_4_;
  fVar31 = auVar40._12_4_;
  local_200._0_4_ =
       (fVar26 * fVar1 + fVar32 * fVar2 + fVar36 * fVar3) * (fVar50 + fVar50 * auVar20._0_4_);
  local_200._4_4_ =
       (fVar29 * fVar1 + fVar33 * fVar2 + fVar37 * fVar3) * (fVar53 + fVar53 * auVar20._4_4_);
  local_200._8_4_ =
       (fVar30 * fVar1 + fVar34 * fVar2 + fVar38 * fVar3) * (fVar54 + fVar54 * auVar20._8_4_);
  local_200._12_4_ =
       (fVar31 * fVar1 + fVar35 * fVar2 + fVar39 * fVar3) * (fVar55 + fVar55 * auVar20._12_4_);
  auVar57 = ZEXT1664(local_200);
  uVar13 = *(undefined4 *)(ray + k * 4 + 0x60);
  auVar47._4_4_ = uVar13;
  auVar47._0_4_ = uVar13;
  auVar47._8_4_ = uVar13;
  auVar47._12_4_ = uVar13;
  auVar20 = vcmpps_avx(auVar47,local_200,2);
  uVar13 = *(undefined4 *)(ray + k * 4 + 0x100);
  auVar51._4_4_ = uVar13;
  auVar51._0_4_ = uVar13;
  auVar51._8_4_ = uVar13;
  auVar51._12_4_ = uVar13;
  auVar47 = vcmpps_avx(local_200,auVar51,2);
  auVar20 = vandps_avx(auVar47,auVar20);
  auVar47 = auVar41 & auVar20;
  if ((((auVar47 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
       (auVar47 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
      (auVar47 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) || auVar47[0xf] < '\0') {
    auVar20 = vandps_avx(auVar20,auVar41);
    auVar28 = vunpckhps_avx(auVar28,auVar48);
    auVar41._0_4_ = local_200._0_4_ * fVar1;
    auVar41._4_4_ = local_200._4_4_ * fVar1;
    auVar41._8_4_ = local_200._8_4_ * fVar1;
    auVar41._12_4_ = local_200._12_4_ * fVar1;
    auVar48._0_4_ = local_200._0_4_ * fVar2;
    auVar48._4_4_ = local_200._4_4_ * fVar2;
    auVar48._8_4_ = local_200._8_4_ * fVar2;
    auVar48._12_4_ = local_200._12_4_ * fVar2;
    auVar52._0_4_ = local_200._0_4_ * fVar3;
    auVar52._4_4_ = local_200._4_4_ * fVar3;
    auVar52._8_4_ = local_200._8_4_ * fVar3;
    auVar52._12_4_ = local_200._12_4_ * fVar3;
    auVar47 = vsubps_avx(auVar40,auVar41);
    auVar41 = vsubps_avx(auVar24,auVar48);
    auVar40 = vsubps_avx(auVar42,auVar52);
    auVar42._0_4_ =
         auVar41._0_4_ * auVar41._0_4_ + auVar40._0_4_ * auVar40._0_4_ +
         auVar47._0_4_ * auVar47._0_4_;
    auVar42._4_4_ =
         auVar41._4_4_ * auVar41._4_4_ + auVar40._4_4_ * auVar40._4_4_ +
         auVar47._4_4_ * auVar47._4_4_;
    auVar42._8_4_ =
         auVar41._8_4_ * auVar41._8_4_ + auVar40._8_4_ * auVar40._8_4_ +
         auVar47._8_4_ * auVar47._8_4_;
    auVar42._12_4_ =
         auVar41._12_4_ * auVar41._12_4_ + auVar40._12_4_ * auVar40._12_4_ +
         auVar47._12_4_ * auVar47._12_4_;
    auVar40._0_4_ = auVar28._0_4_ * auVar28._0_4_;
    auVar40._4_4_ = auVar28._4_4_ * auVar28._4_4_;
    auVar40._8_4_ = auVar28._8_4_ * auVar28._8_4_;
    auVar40._12_4_ = auVar28._12_4_ * auVar28._12_4_;
    auVar47 = vcmpps_avx(auVar42,auVar40,2);
    auVar41 = auVar20 & auVar47;
    if ((((auVar41 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
         (auVar41 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
        (auVar41 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) || auVar41[0xf] < '\0')
    {
      auVar20 = vandps_avx(auVar20,auVar47);
      auVar28._0_4_ = fVar26 * fVar26 + fVar32 * fVar32 + fVar36 * fVar36;
      auVar28._4_4_ = fVar29 * fVar29 + fVar33 * fVar33 + fVar37 * fVar37;
      auVar28._8_4_ = fVar30 * fVar30 + fVar34 * fVar34 + fVar38 * fVar38;
      auVar28._12_4_ = fVar31 * fVar31 + fVar35 * fVar35 + fVar39 * fVar39;
      auVar47 = vcmpps_avx(auVar28,auVar40,6);
      auVar41 = auVar47 & auVar20;
      if ((((auVar41 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
           (auVar41 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
          (auVar41 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) || auVar41[0xf] < '\0'
         ) {
        local_2b0 = vandps_avx(auVar20,auVar47);
        local_1f0._0_8_ = CONCAT44(fVar1,fVar1) ^ 0x8000000080000000;
        local_1f0._8_4_ = -fVar1;
        local_1f0._12_4_ = -fVar1;
        local_220 = ZEXT832(0) << 0x20;
        local_1e0[0] = -fVar2;
        local_1e0[1] = -fVar2;
        local_1e0[2] = -fVar2;
        local_1e0[3] = -fVar2;
        local_1d0[0] = -fVar3;
        local_1d0[1] = -fVar3;
        local_1d0[2] = -fVar3;
        local_1d0[3] = -fVar3;
        auVar43._8_4_ = 0x7f800000;
        auVar43._0_8_ = 0x7f8000007f800000;
        auVar43._12_4_ = 0x7f800000;
        auVar44 = ZEXT1664(auVar43);
        auVar20 = vblendvps_avx(auVar43,local_200,local_2b0);
        auVar47 = vshufps_avx(auVar20,auVar20,0xb1);
        auVar47 = vminps_avx(auVar47,auVar20);
        auVar41 = vshufpd_avx(auVar47,auVar47,1);
        auVar47 = vminps_avx(auVar41,auVar47);
        auVar47 = vcmpps_avx(auVar20,auVar47,0);
        auVar41 = local_2b0 & auVar47;
        auVar20 = local_2b0;
        if ((((auVar41 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
             (auVar41 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            (auVar41 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            auVar41[0xf] < '\0') {
          auVar20 = vandps_avx(auVar47,local_2b0);
        }
        uVar12 = vmovmskps_avx(auVar20);
        uVar16 = 1 << ((byte)k & 0x1f);
        lVar18 = 0;
        if (uVar12 != 0) {
          for (; (uVar12 >> lVar18 & 1) == 0; lVar18 = lVar18 + 1) {
          }
        }
        uVar19 = (ulong)((uVar16 & 0xf) << 4);
        lVar17 = (long)((int)uVar16 >> 4) * 0x10;
        auVar22 = vcmpps_avx(ZEXT832(0) << 0x20,ZEXT832(0) << 0x20,0xf);
        auVar45 = ZEXT3264(auVar22);
        auVar49 = ZEXT464(0) << 0x20;
        do {
          local_230 = &local_180;
          local_250 = &local_2a0;
          uVar12 = *(uint *)(local_190 + lVar18 * 4);
          pRVar14 = (RayHitK<8> *)(ulong)uVar12;
          pGVar6 = (pSVar5->geometries).items[(long)pRVar14].ptr;
          if ((pGVar6->mask & *(uint *)(ray + k * 4 + 0x120)) == 0) {
            *(undefined4 *)(local_2b0 + lVar18 * 4) = 0;
          }
          else {
            if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
               (pGVar6->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
              uVar13 = *(undefined4 *)(local_220 + lVar18 * 4);
              uVar4 = *(undefined4 *)(local_220 + lVar18 * 4 + 0x10);
              *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_200 + lVar18 * 4);
              *(float *)(ray + k * 4 + 0x180) = local_1e0[lVar18 + -4];
              *(float *)(ray + k * 4 + 0x1a0) = local_1e0[lVar18];
              *(float *)(ray + k * 4 + 0x1c0) = local_1d0[lVar18];
              *(undefined4 *)(ray + k * 4 + 0x1e0) = uVar13;
              *(undefined4 *)(ray + k * 4 + 0x200) = uVar4;
              *(uint *)(ray + k * 4 + 0x220) = (Disc->primIDs).field_0.i[lVar18];
              *(uint *)(ray + k * 4 + 0x240) = uVar12;
              *(uint *)(ray + k * 4 + 0x260) = context->user->instID[0];
              *(uint *)(ray + k * 4 + 0x280) = context->user->instPrimID[0];
              return;
            }
            local_120 = *(undefined4 *)(local_220 + lVar18 * 4);
            local_100 = *(undefined4 *)(local_220 + lVar18 * 4 + 0x10);
            local_e0 = (Disc->primIDs).field_0.i[lVar18];
            fVar1 = local_1e0[lVar18 + -4];
            local_180._4_4_ = fVar1;
            local_180._0_4_ = fVar1;
            local_180._8_4_ = fVar1;
            local_180._12_4_ = fVar1;
            local_180._16_4_ = fVar1;
            local_180._20_4_ = fVar1;
            local_180._24_4_ = fVar1;
            local_180._28_4_ = fVar1;
            fVar1 = local_1e0[lVar18];
            local_160._4_4_ = fVar1;
            local_160._0_4_ = fVar1;
            local_160._8_4_ = fVar1;
            local_160._12_4_ = fVar1;
            local_160._16_4_ = fVar1;
            local_160._20_4_ = fVar1;
            local_160._24_4_ = fVar1;
            local_160._28_4_ = fVar1;
            auStack_b0 = vpshufd_avx(ZEXT416(uVar12),0);
            fVar1 = local_1d0[lVar18];
            local_140._4_4_ = fVar1;
            local_140._0_4_ = fVar1;
            local_140._8_4_ = fVar1;
            local_140._12_4_ = fVar1;
            local_140._16_4_ = fVar1;
            local_140._20_4_ = fVar1;
            local_140._24_4_ = fVar1;
            local_140._28_4_ = fVar1;
            uStack_11c = local_120;
            uStack_118 = local_120;
            uStack_114 = local_120;
            uStack_110 = local_120;
            uStack_10c = local_120;
            uStack_108 = local_120;
            uStack_104 = local_120;
            uStack_fc = local_100;
            uStack_f8 = local_100;
            uStack_f4 = local_100;
            uStack_f0 = local_100;
            uStack_ec = local_100;
            uStack_e8 = local_100;
            uStack_e4 = local_100;
            uStack_dc = local_e0;
            uStack_d8 = local_e0;
            uStack_d4 = local_e0;
            uStack_d0 = local_e0;
            uStack_cc = local_e0;
            uStack_c8 = local_e0;
            uStack_c4 = local_e0;
            local_c0 = auStack_b0;
            local_1c0 = auVar45._0_32_;
            uStack_9c = context->user->instID[0];
            local_a0 = uStack_9c;
            uStack_98 = uStack_9c;
            uStack_94 = uStack_9c;
            uStack_90 = uStack_9c;
            uStack_8c = uStack_9c;
            uStack_88 = uStack_9c;
            uStack_84 = uStack_9c;
            uStack_7c = context->user->instPrimID[0];
            local_80 = uStack_7c;
            uStack_78 = uStack_7c;
            uStack_74 = uStack_7c;
            uStack_70 = uStack_7c;
            uStack_6c = uStack_7c;
            uStack_68 = uStack_7c;
            uStack_64 = uStack_7c;
            uVar13 = *(undefined4 *)(ray + k * 4 + 0x100);
            *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_200 + lVar18 * 4);
            local_2a0 = *(undefined8 *)(mm_lookupmask_ps + uVar19);
            uStack_298 = *(undefined8 *)(mm_lookupmask_ps + uVar19 + 8);
            local_290 = *(undefined8 *)(mm_lookupmask_ps + lVar17);
            uStack_288 = *(undefined8 *)(mm_lookupmask_ps + lVar17 + 8);
            local_248 = pGVar6->userPtr;
            local_240 = context->user;
            local_228 = 8;
            pRVar14 = (RayHitK<8> *)pGVar6->intersectionFilterN;
            local_238 = ray;
            if (pRVar14 != (RayHitK<8> *)0x0) {
              local_270 = auVar57._0_16_;
              local_258 = Disc;
              pRVar14 = (RayHitK<8> *)(*(code *)pRVar14)(&local_250);
              auVar49 = ZEXT1664(ZEXT816(0) << 0x40);
              auVar45 = ZEXT3264(local_1c0);
              auVar44 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
              auVar57 = ZEXT1664(local_270);
              Disc = local_258;
            }
            auVar8._8_8_ = uStack_298;
            auVar8._0_8_ = local_2a0;
            auVar20 = vpcmpeqd_avx(auVar49._0_16_,auVar8);
            auVar10._8_8_ = uStack_288;
            auVar10._0_8_ = local_290;
            auVar47 = vpcmpeqd_avx(auVar49._0_16_,auVar10);
            auVar22._16_16_ = auVar47;
            auVar22._0_16_ = auVar20;
            local_1c0 = auVar45._0_32_;
            auVar22 = local_1c0 & ~auVar22;
            if ((((((((auVar22 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar22 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar22 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar22 >> 0x7f,0) == '\0') &&
                  (auVar22 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(auVar22 >> 0xbf,0) == '\0') &&
                (auVar22 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < auVar22[0x1f]) {
              auVar23._0_4_ = auVar45._0_4_ ^ auVar20._0_4_;
              auVar23._4_4_ = auVar45._4_4_ ^ auVar20._4_4_;
              auVar23._8_4_ = auVar45._8_4_ ^ auVar20._8_4_;
              auVar23._12_4_ = auVar45._12_4_ ^ auVar20._12_4_;
              auVar23._16_4_ = auVar45._16_4_ ^ auVar47._0_4_;
              auVar23._20_4_ = auVar45._20_4_ ^ auVar47._4_4_;
              auVar23._24_4_ = auVar45._24_4_ ^ auVar47._8_4_;
              auVar23._28_4_ = auVar45._28_4_ ^ auVar47._12_4_;
            }
            else {
              pRVar14 = (RayHitK<8> *)context->args->filter;
              if ((pRVar14 != (RayHitK<8> *)0x0) &&
                 (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                   RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar6->field_8).field_0x2 & 0x40) != 0)))) {
                local_270 = auVar57._0_16_;
                pRVar14 = (RayHitK<8> *)(*(code *)pRVar14)(&local_250);
                auVar49 = ZEXT1664(ZEXT816(0) << 0x40);
                auVar45 = ZEXT3264(local_1c0);
                auVar44 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
                auVar57 = ZEXT1664(local_270);
              }
              auVar9._8_8_ = uStack_298;
              auVar9._0_8_ = local_2a0;
              auVar20 = vpcmpeqd_avx(auVar49._0_16_,auVar9);
              auVar11._8_8_ = uStack_288;
              auVar11._0_8_ = local_290;
              auVar47 = vpcmpeqd_avx(auVar49._0_16_,auVar11);
              auVar25._16_16_ = auVar47;
              auVar25._0_16_ = auVar20;
              auVar23._0_4_ = auVar45._0_4_ ^ auVar20._0_4_;
              auVar23._4_4_ = auVar45._4_4_ ^ auVar20._4_4_;
              auVar23._8_4_ = auVar45._8_4_ ^ auVar20._8_4_;
              auVar23._12_4_ = auVar45._12_4_ ^ auVar20._12_4_;
              auVar23._16_4_ = auVar45._16_4_ ^ auVar47._0_4_;
              auVar23._20_4_ = auVar45._20_4_ ^ auVar47._4_4_;
              auVar23._24_4_ = auVar45._24_4_ ^ auVar47._8_4_;
              auVar23._28_4_ = auVar45._28_4_ ^ auVar47._12_4_;
              auVar22 = auVar45._0_32_ & ~auVar25;
              if ((((((((auVar22 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar22 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar22 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar22 >> 0x7f,0) != '\0') ||
                    (auVar22 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar22 >> 0xbf,0) != '\0') ||
                  (auVar22 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar22[0x1f] < '\0') {
                auVar22 = vmaskmovps_avx(auVar23,*local_230);
                *(undefined1 (*) [32])(local_238 + 0x180) = auVar22;
                auVar22 = vmaskmovps_avx(auVar23,local_230[1]);
                *(undefined1 (*) [32])(local_238 + 0x1a0) = auVar22;
                auVar22 = vmaskmovps_avx(auVar23,local_230[2]);
                *(undefined1 (*) [32])(local_238 + 0x1c0) = auVar22;
                auVar22 = vmaskmovps_avx(auVar23,local_230[3]);
                *(undefined1 (*) [32])(local_238 + 0x1e0) = auVar22;
                auVar22 = vmaskmovps_avx(auVar23,local_230[4]);
                *(undefined1 (*) [32])(local_238 + 0x200) = auVar22;
                auVar22 = vmaskmovps_avx(auVar23,local_230[5]);
                *(undefined1 (*) [32])(local_238 + 0x220) = auVar22;
                auVar22 = vmaskmovps_avx(auVar23,local_230[6]);
                *(undefined1 (*) [32])(local_238 + 0x240) = auVar22;
                auVar22 = vmaskmovps_avx(auVar23,local_230[7]);
                *(undefined1 (*) [32])(local_238 + 0x260) = auVar22;
                auVar22 = vmaskmovps_avx(auVar23,local_230[8]);
                *(undefined1 (*) [32])(local_238 + 0x280) = auVar22;
                pRVar14 = local_238;
              }
            }
            if ((((((((auVar23 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar23 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar23 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar23 >> 0x7f,0) == '\0') &&
                  (auVar23 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(auVar23 >> 0xbf,0) == '\0') &&
                (auVar23 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < auVar23[0x1f]) {
              *(undefined4 *)(ray + k * 4 + 0x100) = uVar13;
            }
            *(undefined4 *)(local_2b0 + lVar18 * 4) = 0;
            uVar13 = *(undefined4 *)(ray + k * 4 + 0x100);
            auVar21._4_4_ = uVar13;
            auVar21._0_4_ = uVar13;
            auVar21._8_4_ = uVar13;
            auVar21._12_4_ = uVar13;
            auVar20 = vcmpps_avx(auVar57._0_16_,auVar21,2);
            local_2b0 = vandps_avx(auVar20,local_2b0);
          }
          if ((((local_2b0 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
               (local_2b0 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
              (local_2b0 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
              -1 < local_2b0[0xf]) {
            return;
          }
          auVar20 = vblendvps_avx(auVar44._0_16_,auVar57._0_16_,local_2b0);
          auVar47 = vshufps_avx(auVar20,auVar20,0xb1);
          auVar47 = vminps_avx(auVar47,auVar20);
          auVar41 = vshufpd_avx(auVar47,auVar47,1);
          auVar47 = vminps_avx(auVar41,auVar47);
          auVar47 = vcmpps_avx(auVar20,auVar47,0);
          auVar41 = local_2b0 & auVar47;
          auVar20 = local_2b0;
          if ((((auVar41 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
               (auVar41 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar41 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              auVar41[0xf] < '\0') {
            auVar20 = vandps_avx(auVar47,local_2b0);
          }
          uVar13 = vmovmskps_avx(auVar20);
          uVar15 = CONCAT44((int)((ulong)pRVar14 >> 0x20),uVar13);
          lVar18 = 0;
          if (uVar15 != 0) {
            for (; (uVar15 >> lVar18 & 1) == 0; lVar18 = lVar18 + 1) {
            }
          }
        } while( true );
      }
    }
  }
  return;
}

Assistant:

static __forceinline void intersect(
          const Precalculations& pre, RayHitK<K>& ray, size_t k, RayQueryContext* context, const Primitive& Disc)
      {
        STAT3(normal.trav_prims, 1, 1, 1);
        const Points* geom = context->scene->get<Points>(Disc.geomID());
        Vec4vf<M> v0; Disc.gather(v0, geom);
        const vbool<M> valid = Disc.valid();
        DiscIntersectorK<M, K>::intersect(
            valid, ray, k, context, geom, pre, v0,
            Intersect1KEpilogM<M, K, filter>(ray, k, context, Disc.geomID(), Disc.primID()));
      }